

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

int rr::anon_unknown_1::getComponentSize(VertexAttribType type)

{
  int local_c;
  VertexAttribType type_local;
  
  switch(type) {
  case VERTEXATTRIBTYPE_FLOAT:
    local_c = 4;
    break;
  case VERTEXATTRIBTYPE_HALF:
    local_c = 2;
    break;
  case VERTEXATTRIBTYPE_FIXED:
    local_c = 4;
    break;
  case VERTEXATTRIBTYPE_DOUBLE:
    local_c = 8;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UNORM8:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UNORM16:
    local_c = 2;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UNORM32:
    local_c = 4;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM8_CLAMP:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM16_CLAMP:
    local_c = 2;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM32_CLAMP:
    local_c = 4;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM8_SCALE:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM16_SCALE:
    local_c = 2;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM32_SCALE:
    local_c = 4;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UINT8:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UINT16:
    local_c = 2;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UINT32:
    local_c = 4;
    break;
  case VERTEXATTRIBTYPE_NONPURE_INT8:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_INT16:
    local_c = 2;
    break;
  case VERTEXATTRIBTYPE_NONPURE_INT32:
    local_c = 4;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UINT_2_10_10_10_REV:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_INT_2_10_10_10_REV:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_PURE_UINT8:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_PURE_UINT16:
    local_c = 2;
    break;
  case VERTEXATTRIBTYPE_PURE_UINT32:
    local_c = 4;
    break;
  case VERTEXATTRIBTYPE_PURE_INT8:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_PURE_INT16:
    local_c = 2;
    break;
  case VERTEXATTRIBTYPE_PURE_INT32:
    local_c = 4;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UNORM8_BGRA:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV_BGRA:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP_BGRA:
    local_c = 1;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA:
    local_c = 1;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

int getComponentSize (const VertexAttribType type)
{
	switch (type)
	{
		case VERTEXATTRIBTYPE_FLOAT:									return 4;
		case VERTEXATTRIBTYPE_HALF:										return 2;
		case VERTEXATTRIBTYPE_FIXED:									return 4;
		case VERTEXATTRIBTYPE_DOUBLE:									return (int)sizeof(double);
		case VERTEXATTRIBTYPE_NONPURE_UNORM8:							return 1;
		case VERTEXATTRIBTYPE_NONPURE_UNORM16:							return 2;
		case VERTEXATTRIBTYPE_NONPURE_UNORM32:							return 4;
		case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV:				return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM8_CLAMP:						return 1;
		case VERTEXATTRIBTYPE_NONPURE_SNORM16_CLAMP:					return 2;
		case VERTEXATTRIBTYPE_NONPURE_SNORM32_CLAMP:					return 4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP:		return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM8_SCALE:						return 1;
		case VERTEXATTRIBTYPE_NONPURE_SNORM16_SCALE:					return 2;
		case VERTEXATTRIBTYPE_NONPURE_SNORM32_SCALE:					return 4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE:		return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_UINT8:							return 1;
		case VERTEXATTRIBTYPE_NONPURE_UINT16:							return 2;
		case VERTEXATTRIBTYPE_NONPURE_UINT32:							return 4;
		case VERTEXATTRIBTYPE_NONPURE_INT8:								return 1;
		case VERTEXATTRIBTYPE_NONPURE_INT16:							return 2;
		case VERTEXATTRIBTYPE_NONPURE_INT32:							return 4;
		case VERTEXATTRIBTYPE_NONPURE_UINT_2_10_10_10_REV:				return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_INT_2_10_10_10_REV:				return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_PURE_UINT8:								return 1;
		case VERTEXATTRIBTYPE_PURE_UINT16:								return 2;
		case VERTEXATTRIBTYPE_PURE_UINT32:								return 4;
		case VERTEXATTRIBTYPE_PURE_INT8:								return 1;
		case VERTEXATTRIBTYPE_PURE_INT16:								return 2;
		case VERTEXATTRIBTYPE_PURE_INT32:								return 4;
		case VERTEXATTRIBTYPE_NONPURE_UNORM8_BGRA:						return 1;
		case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV_BGRA:		return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP_BGRA:	return (int)sizeof(deUint32)/4;
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA:	return (int)sizeof(deUint32)/4;
		default:
			DE_ASSERT(false);
			return 0;
	}
}